

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O0

size_t __thiscall
google::protobuf::internal::DynamicMapField::SpaceUsedExcludingSelfNoLock(DynamicMapField *this)

{
  bool bVar1;
  CppType CVar2;
  Reflection *this_00;
  size_t sVar3;
  const_iterator *a;
  long in_RDI;
  MapValueRef *unaff_retaddr;
  Message *message;
  MapValueRef *in_stack_00000030;
  const_iterator it;
  size_t map_size;
  size_t size;
  const_iterator *in_stack_ffffffffffffff98;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *in_stack_ffffffffffffffd0;
  Message *in_stack_ffffffffffffffe0;
  size_t local_10;
  
  local_10 = 0;
  if (*(long *)(in_RDI + 0x10) != 0) {
    local_10 = RepeatedPtrField<google::protobuf::Message>::SpaceUsedExcludingSelfLong
                         ((RepeatedPtrField<google::protobuf::Message> *)0x419ed1);
  }
  local_10 = local_10 + 0x18;
  this_00 = (Reflection *)
            Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::size
                      ((Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *)0x419ef7);
  if (this_00 != (Reflection *)0x0) {
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::begin(in_stack_ffffffffffffffd0);
    local_10 = (long)this_00 * 0x20 + local_10;
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::const_iterator::operator->
              ((const_iterator *)0x419f4b);
    CVar2 = MapKey::type((MapKey *)unaff_retaddr);
    if (CVar2 == CPPTYPE_STRING) {
      local_10 = (long)this_00 * 0x20 + local_10;
    }
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::const_iterator::operator->
              ((const_iterator *)0x419f75);
    CVar2 = MapValueRef::type(unaff_retaddr);
    a = (const_iterator *)(ulong)(CVar2 - CPPTYPE_INT32);
    switch(a) {
    case (const_iterator *)0x0:
      local_10 = (long)this_00 * 4 + local_10;
      break;
    case (const_iterator *)0x1:
      local_10 = (long)this_00 * 8 + local_10;
      break;
    case (const_iterator *)0x2:
      local_10 = (long)this_00 * 4 + local_10;
      break;
    case (const_iterator *)0x3:
      local_10 = (long)this_00 * 8 + local_10;
      break;
    case (const_iterator *)0x4:
      local_10 = (long)this_00 * 8 + local_10;
      break;
    case (const_iterator *)0x5:
      local_10 = (long)this_00 * 4 + local_10;
      break;
    case (const_iterator *)0x6:
      local_10 = (long)&this_00->descriptor_ + local_10;
      break;
    case (const_iterator *)0x7:
      local_10 = (long)this_00 * 4 + local_10;
      break;
    case (const_iterator *)0x8:
      local_10 = (long)this_00 * 0x20 + local_10;
      break;
    case (const_iterator *)0x9:
      while( true ) {
        Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::end(in_stack_ffffffffffffffd0)
        ;
        bVar1 = protobuf::operator!=(a,in_stack_ffffffffffffff98);
        if (!bVar1) break;
        Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::const_iterator::operator->
                  ((const_iterator *)0x41a0b1);
        MapValueRef::GetMessageValue(in_stack_00000030);
        Message::GetReflection((Message *)a);
        sVar3 = Reflection::SpaceUsedLong(this_00,in_stack_ffffffffffffffe0);
        local_10 = sVar3 + local_10;
        Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::const_iterator::operator++(a);
      }
    }
  }
  return local_10;
}

Assistant:

size_t DynamicMapField::SpaceUsedExcludingSelfNoLock() const {
  size_t size = 0;
  if (MapFieldBase::repeated_field_ != NULL) {
    size += MapFieldBase::repeated_field_->SpaceUsedExcludingSelfLong();
  }
  size += sizeof(map_);
  size_t map_size = map_.size();
  if (map_size) {
    Map<MapKey, MapValueRef>::const_iterator it = map_.begin();
    size += sizeof(it->first) * map_size;
    size += sizeof(it->second) * map_size;
    // If key is string, add the allocated space.
    if (it->first.type() == FieldDescriptor::CPPTYPE_STRING) {
      size += sizeof(std::string) * map_size;
    }
    // Add the allocated space in MapValueRef.
    switch (it->second.type()) {
#define HANDLE_TYPE(CPPTYPE, TYPE)           \
  case FieldDescriptor::CPPTYPE_##CPPTYPE: { \
    size += sizeof(TYPE) * map_size;         \
    break;                                   \
  }
      HANDLE_TYPE(INT32, int32);
      HANDLE_TYPE(INT64, int64);
      HANDLE_TYPE(UINT32, uint32);
      HANDLE_TYPE(UINT64, uint64);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE(FLOAT, float);
      HANDLE_TYPE(BOOL, bool);
      HANDLE_TYPE(STRING, std::string);
      HANDLE_TYPE(ENUM, int32);
#undef HANDLE_TYPE
      case FieldDescriptor::CPPTYPE_MESSAGE: {
        while (it != map_.end()) {
          const Message& message = it->second.GetMessageValue();
          size += message.GetReflection()->SpaceUsedLong(message);
          ++it;
        }
        break;
      }
    }
  }
  return size;
}